

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::makeAbsoluteTicks(MidiFile *this)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  MidiEvent *pMVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  if (this->m_theTimeState == 1) {
    return;
  }
  uVar2 = (long)(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (uint)(uVar2 >> 3);
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar7) {
    uVar5 = (long)(uVar2 * 0x20000000) >> 0x1e & 0xfffffffffffffffc;
  }
  pvVar3 = operator_new__(uVar5);
  if (0 < (int)uVar7) {
    uVar5 = 0;
    do {
      *(undefined4 *)((long)pvVar3 + uVar5 * 4) = 0;
      iVar1 = MidiEventList::size((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5]);
      if (0 < iVar1) {
        pMVar4 = MidiEventList::operator[]
                           ((this->m_events).
                            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5],0);
        *(int *)((long)pvVar3 + uVar5 * 4) = pMVar4->tick;
        iVar1 = MidiEventList::size((this->m_events).
                                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5]);
        if (1 < iVar1) {
          iVar1 = 1;
          do {
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar5],iVar1);
            iVar6 = *(int *)((long)pvVar3 + uVar5 * 4) + pMVar4->tick;
            *(int *)((long)pvVar3 + uVar5 * 4) = iVar6;
            pMVar4 = MidiEventList::operator[]
                               ((this->m_events).
                                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar5],iVar1);
            pMVar4->tick = iVar6;
            iVar1 = iVar1 + 1;
            iVar6 = MidiEventList::size((this->m_events).
                                        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar5]);
          } while (iVar1 < iVar6);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar7 & 0x7fffffff));
  }
  this->m_theTimeState = 1;
  operator_delete__(pvVar3);
  return;
}

Assistant:

void MidiFile::makeAbsoluteTicks(void) {
	if (getTickState() == TIME_STATE_ABSOLUTE) {
		return;
	}
	int i, j;
	int length = getNumTracks();
	int* timedata = new int[length];
	for (i=0; i<length; i++) {
		timedata[i] = 0;
		if (m_events[i]->size() > 0) {
			timedata[i] = (*m_events[i])[0].tick;
		} else {
			continue;
		}
		for (j=1; j<(int)m_events[i]->size(); j++) {
			timedata[i] += (*m_events[i])[j].tick;
			(*m_events[i])[j].tick = timedata[i];
		}
	}
	m_theTimeState = TIME_STATE_ABSOLUTE;
	delete [] timedata;
}